

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

size_t __thiscall llama_context::state_read_data(llama_context *this,llama_io_read_i *io)

{
  uint uVar1;
  pointer piVar2;
  int32_t iVar3;
  bool bVar4;
  int32_t iVar5;
  int iVar6;
  char *__s;
  undefined4 extraout_var;
  runtime_error *prVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string arch_str;
  string cur_arch_str;
  int32_t n_outputs;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reading state\n","state_read_data");
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading model info\n","state_read_data");
  __s = llm_arch_name(LLM_ARCH_LLAMA);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cur_arch_str,__s,(allocator<char> *)&arch_str);
  arch_str._M_dataplus._M_p = (pointer)&arch_str.field_2;
  arch_str._M_string_length = 0;
  arch_str.field_2._M_allocated_capacity =
       arch_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  llama_io_read_i::read_string(io,&arch_str);
  bVar4 = std::operator!=(&cur_arch_str,&arch_str);
  if (bVar4) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((string *)&n_outputs,"wrong model arch: \'%s\' instead of \'%s\'",
                      arch_str._M_dataplus._M_p,cur_arch_str._M_dataplus._M_p);
    std::runtime_error::runtime_error(prVar7,(string *)&n_outputs);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&arch_str);
  std::__cxx11::string::~string((string *)&cur_arch_str);
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading output ids\n","state_read_data");
  n_outputs = this->n_outputs;
  (*io->_vptr_llama_io_read_i[3])(io,&n_outputs,4);
  iVar3 = n_outputs;
  iVar5 = output_reserve(this,n_outputs);
  if (iVar5 < iVar3) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"could not reserve outputs");
  }
  else {
    arch_str.field_2._M_allocated_capacity = 0;
    arch_str._M_dataplus._M_p = (pointer)0x0;
    arch_str._M_string_length = 0;
    if ((long)n_outputs != 0) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&arch_str,(long)n_outputs);
      (*io->_vptr_llama_io_read_i[3])(io,arch_str._M_dataplus._M_p,(long)n_outputs << 2);
      uVar8 = arch_str._M_string_length - (long)arch_str._M_dataplus._M_p >> 2;
      piVar2 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar1 = *(uint *)(arch_str._M_dataplus._M_p + uVar10 * 4);
        if ((this->cparams).n_batch <= uVar1) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_(&cur_arch_str,"invalid output id, %d does not fit in batch size of %u",
                            (ulong)uVar1,(ulong)(this->cparams).n_batch);
          std::runtime_error::runtime_error(prVar7,(string *)&cur_arch_str);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        piVar2[(int)uVar1] = (int)uVar10;
      }
      this->n_outputs = n_outputs;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&arch_str);
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading logits\n","state_read_data");
    (*io->_vptr_llama_io_read_i[3])(io,&cur_arch_str,8);
    if ((pointer)this->logits_size < cur_arch_str._M_dataplus._M_p) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"logits buffer too small");
    }
    else {
      if (cur_arch_str._M_dataplus._M_p != (pointer)0x0) {
        (*io->_vptr_llama_io_read_i[3])(io,this->logits,(long)cur_arch_str._M_dataplus._M_p << 2);
      }
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading embeddings\n","state_read_data");
      (*io->_vptr_llama_io_read_i[3])(io,&cur_arch_str,8);
      if (cur_arch_str._M_dataplus._M_p <= (pointer)this->embd_size) {
        if (cur_arch_str._M_dataplus._M_p != (pointer)0x0) {
          (*io->_vptr_llama_io_read_i[3])(io,this->embd,(long)cur_arch_str._M_dataplus._M_p << 2);
        }
        llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading KV self\n","state_read_data");
        llama_kv_cache_unified::state_read
                  ((this->kv_self)._M_t.
                   super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                   .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,io,-1);
        iVar6 = (*io->_vptr_llama_io_read_i[4])(io);
        return CONCAT44(extraout_var,iVar6);
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"embeddings buffer too small");
    }
  }
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t llama_context::state_read_data(llama_io_read_i & io) {
    LLAMA_LOG_DEBUG("%s: reading state\n", __func__);

    // read model info
    {
        LLAMA_LOG_DEBUG("%s: - reading model info\n", __func__);

        const std::string cur_arch_str = llm_arch_name(model.arch);

        std::string arch_str;
        io.read_string(arch_str);
        if (cur_arch_str != arch_str) {
            throw std::runtime_error(format("wrong model arch: '%s' instead of '%s'", arch_str.c_str(), cur_arch_str.c_str()));
        }
        // TODO: add more info which needs to be identical but which is not verified otherwise
    }

    // read output ids
    {
        LLAMA_LOG_DEBUG("%s: - reading output ids\n", __func__);

        auto n_outputs = this->n_outputs;
        io.read_to(&n_outputs, sizeof(n_outputs));

        if (n_outputs > output_reserve(n_outputs)) {
            throw std::runtime_error("could not reserve outputs");
        }

        std::vector<int32_t> output_pos;

        if (n_outputs) {
            output_pos.resize(n_outputs);
            io.read_to(output_pos.data(), n_outputs * sizeof(int32_t));

            for (int32_t i = 0; i < (int32_t) output_pos.size(); ++i) {
                int32_t id = output_pos[i];
                if ((uint32_t) id >= n_batch()) {
                    throw std::runtime_error(format("invalid output id, %d does not fit in batch size of %u", id, n_batch()));
                }
                this->output_ids[id] = i;
            }

            this->n_outputs = n_outputs;
        }
    }

    // read logits
    {
        LLAMA_LOG_DEBUG("%s: - reading logits\n", __func__);

        uint64_t logits_size;
        io.read_to(&logits_size, sizeof(logits_size));

        if (this->logits_size < logits_size) {
            throw std::runtime_error("logits buffer too small");
        }

        if (logits_size) {
            io.read_to(this->logits, logits_size * sizeof(float));
        }
    }

    // read embeddings
    {
        LLAMA_LOG_DEBUG("%s: - reading embeddings\n", __func__);

        uint64_t embd_size;
        io.read_to(&embd_size, sizeof(embd_size));

        if (this->embd_size < embd_size) {
            throw std::runtime_error("embeddings buffer too small");
        }

        if (embd_size) {
            io.read_to(this->embd, embd_size * sizeof(float));
        }
    }

    LLAMA_LOG_DEBUG("%s: - reading KV self\n", __func__);
    kv_self->state_read(io);

    return io.n_bytes();
}